

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenStructSet(BinaryenModuleRef module,BinaryenIndex index,BinaryenExpressionRef ref,
                 BinaryenExpressionRef value)

{
  StructSet *pSVar1;
  Builder local_30;
  Expression *local_28;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef pMStack_10;
  BinaryenIndex index_local;
  BinaryenModuleRef module_local;
  
  local_28 = value;
  value_local = ref;
  ref_local._4_4_ = index;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_30,module);
  pSVar1 = wasm::Builder::makeStructSet(&local_30,ref_local._4_4_,value_local,local_28,Unordered);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStructSet(BinaryenModuleRef module,
                                        BinaryenIndex index,
                                        BinaryenExpressionRef ref,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStructSet(
        index, (Expression*)ref, (Expression*)value, MemoryOrder::Unordered));
}